

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::split_lines<false,2>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*s_) [2])

{
  directory *this_00;
  _Ios_Openmode _Var1;
  string *__lhs;
  char *pcVar2;
  size_t in_RCX;
  void *__buf;
  char *s__00;
  char *s__01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__02;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *c_;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__00;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__02;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__03;
  basic_file_view<false> *c__04;
  allocator<char> local_1251;
  string local_1250;
  assert_equal_container local_1230;
  allocator<char> local_1201;
  string local_1200;
  assert_equal_container local_11e0;
  allocator<char> local_11b1;
  string local_11b0;
  assert_equal_container local_1190;
  allocator<char> local_1161;
  string local_1160;
  assert_equal_container local_1140;
  allocator<char> local_1111;
  string local_1110;
  assert_equal_container local_10f0;
  allocator<char> local_10c1;
  string local_10c0;
  assert_equal_container local_10a0;
  allocator<char> local_1071;
  string local_1070;
  assert_equal_container local_1050;
  allocator<char> local_1021;
  string local_1020;
  assert_equal_container local_1000;
  allocator<char> local_fd1;
  string local_fd0;
  assert_equal_container local_fb0;
  allocator<char> local_f81;
  string local_f80;
  assert_equal_container local_f60;
  undefined1 local_f38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v4;
  string local_e58 [32];
  undefined1 local_e38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v2;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> local_e00;
  undefined1 local_df8 [8];
  basic_file_view<false> view6;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view5;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view4;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view3;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view2;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  view1;
  undefined1 local_bc0 [8];
  string str;
  string local_b98 [32];
  istringstream local_b78 [8];
  istringstream s3;
  allocator<char> local_9f1;
  string local_9f0 [32];
  istringstream local_9d0 [8];
  istringstream s2;
  allocator<char> local_849;
  string local_848 [32];
  istringstream local_828 [8];
  istringstream s1;
  istream local_6a8 [8];
  ifstream fs3;
  istream local_4a0 [8];
  ifstream fs2;
  istream local_298 [8];
  ifstream fs1;
  allocator<char> local_89;
  string local_88 [48];
  undefined1 local_58 [8];
  string path;
  directory tmp;
  char (*s__local) [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v1;
  
  this_00 = (directory *)((long)&path.field_2 + 8);
  just::temp::directory::directory(this_00);
  __lhs = just::temp::directory::path_abi_cxx11_(this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,__lhs
                 ,"/test");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,(char *)this,&local_89);
  just::file::write((file *)local_58,(int)local_88,__buf,in_RCX);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  _Var1 = std::operator|(_S_bin,_S_in);
  std::ifstream::ifstream(local_298,pcVar2,_Var1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  _Var1 = std::operator|(_S_bin,_S_in);
  std::ifstream::ifstream(local_4a0,pcVar2,_Var1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  _Var1 = std::operator|(_S_bin,_S_in);
  std::ifstream::ifstream(local_6a8,pcVar2,_Var1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_848,(char *)this,&local_849);
  std::__cxx11::istringstream::istringstream(local_828,local_848,_S_in);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9f0,(char *)this,&local_9f1);
  std::__cxx11::istringstream::istringstream(local_9d0,local_9f0,_S_in);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b98,(char *)this,(allocator<char> *)(str.field_2._M_local_buf + 0xf));
  std::__cxx11::istringstream::istringstream(local_b78,local_b98,_S_in);
  std::__cxx11::string::~string(local_b98);
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_bc0,(char *)this,(allocator<char> *)((long)&view1._string + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&view1._string + 7));
  just::lines::
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::basic_view((basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)&view2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc0);
  just::lines::basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false>::basic_view
            (&view3,(istream *)local_828);
  just::lines::basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false>::basic_view
            (&view4,local_298);
  just::lines::basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false>::basic_view
            (&view5,(istream *)local_9d0);
  just::lines::basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false>::basic_view
            ((basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *)
             &view6.field_0x200,local_4a0);
  just::lines::basic_file_view<false>::basic_file_view
            ((basic_file_view<false> *)local_df8,(string *)local_58);
  local_e00 = just::lines::basic_file_view::operator_cast_to_basic_view
                        ((basic_file_view *)local_df8);
  converts_to<just::lines::basic_view<std::istream,false>>(&local_e00);
  just::lines::split<false,char_const>(__return_storage_ptr__,(lines *)this,s__00);
  just::lines::split<false,char_const>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v3.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(lines *)this,s__01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e58,(char *)this,
             (allocator<char> *)
             ((long)&v4.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  just::lines::split<false,std::__cxx11::string>((type *)local_e38,(lines *)local_e58,s__02);
  std::__cxx11::string::~string(local_e58);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v4.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  just::lines::split<false>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v5.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(istream *)local_b78);
  just::lines::split<false>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v6.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_6a8);
  just::lines::split_lines_of_file<false>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v7.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_58);
  create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(_anonymous_namespace_ *)&view2,
             c_);
  create_vector<just::lines::basic_view<std::istream,false>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v9.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(_anonymous_namespace_ *)&view3,
             c__00);
  create_vector<just::lines::basic_view<std::istream,false>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v10.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(_anonymous_namespace_ *)&view4,
             c__01);
  create_vector<just::lines::basic_view<std::istream,false>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v11.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(_anonymous_namespace_ *)&view5,
             c__02);
  create_vector<just::lines::basic_view<std::istream,false>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v12.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (_anonymous_namespace_ *)&view6.field_0x200,c__03);
  create_vector<just::lines::basic_file_view<false>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f38,(_anonymous_namespace_ *)local_df8,c__04);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_f81);
  just::test::assert_equal_container::assert_equal_container(&local_f60,&local_f80,0x57);
  just::test::assert_equal_container::operator()
            (&local_f60,__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v3.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_f60);
  std::__cxx11::string::~string((string *)&local_f80);
  std::allocator<char>::~allocator(&local_f81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_fd1);
  just::test::assert_equal_container::assert_equal_container(&local_fb0,&local_fd0,0x58);
  just::test::assert_equal_container::operator()
            (&local_fb0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v3.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e38);
  just::test::assert_equal_container::~assert_equal_container(&local_fb0);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::allocator<char>::~allocator(&local_fd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1021);
  just::test::assert_equal_container::assert_equal_container(&local_1000,&local_1020,0x59);
  just::test::assert_equal_container::operator()
            (&local_1000,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e38,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v5.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_1000);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1070,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1071);
  just::test::assert_equal_container::assert_equal_container(&local_1050,&local_1070,0x5a);
  just::test::assert_equal_container::operator()
            (&local_1050,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v5.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v6.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_1050);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator(&local_1071);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10c0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_10c1);
  just::test::assert_equal_container::assert_equal_container(&local_10a0,&local_10c0,0x5b);
  just::test::assert_equal_container::operator()
            (&local_10a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v6.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v7.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_10a0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator(&local_10c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1110,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1111);
  just::test::assert_equal_container::assert_equal_container(&local_10f0,&local_1110,0x5c);
  just::test::assert_equal_container::operator()
            (&local_10f0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v7.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_10f0);
  std::__cxx11::string::~string((string *)&local_1110);
  std::allocator<char>::~allocator(&local_1111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1160,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1161);
  just::test::assert_equal_container::assert_equal_container(&local_1140,&local_1160,0x5d);
  just::test::assert_equal_container::operator()
            (&local_1140,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v9.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_1140);
  std::__cxx11::string::~string((string *)&local_1160);
  std::allocator<char>::~allocator(&local_1161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_11b1);
  just::test::assert_equal_container::assert_equal_container(&local_1190,&local_11b0,0x5e);
  just::test::assert_equal_container::operator()
            (&local_1190,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v9.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v10.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_1190);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::allocator<char>::~allocator(&local_11b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1200,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1201);
  just::test::assert_equal_container::assert_equal_container(&local_11e0,&local_1200,0x5f);
  just::test::assert_equal_container::operator()
            (&local_11e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v10.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v11.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_11e0);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator(&local_1201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1250,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_1251);
  just::test::assert_equal_container::assert_equal_container(&local_1230,&local_1250,0x60);
  just::test::assert_equal_container::operator()
            (&local_1230,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v11.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&v12.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::test::assert_equal_container::~assert_equal_container(&local_1230);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v12.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v11.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v10.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v9.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v7.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v6.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v5.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&v3.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  just::lines::basic_file_view<false>::~basic_file_view((basic_file_view<false> *)local_df8);
  std::__cxx11::string::~string((string *)local_bc0);
  std::__cxx11::istringstream::~istringstream(local_b78);
  std::__cxx11::istringstream::~istringstream(local_9d0);
  std::__cxx11::istringstream::~istringstream(local_828);
  std::ifstream::~ifstream(local_6a8);
  std::ifstream::~ifstream(local_4a0);
  std::ifstream::~ifstream(local_298);
  std::__cxx11::string::~string((string *)local_58);
  just::temp::directory::~directory((directory *)((long)&path.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split_lines(const char (&s_)[N])
  {
    using std::vector;
    using std::string;

    just::temp::directory tmp;
    const std::string path = tmp.path() + "/test";
    just::file::write(path, s_);

    std::ifstream fs1(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs2(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs3(path.c_str(), std::ios_base::binary | std::ios_base::in);

    std::istringstream s1(s_);
    std::istringstream s2(s_);
    std::istringstream s3(s_);

    const std::string str(s_);
    const just::lines::basic_view<string, KeepNewlines> view1(str);
    just::lines::basic_view<std::istream, KeepNewlines> view2(s1);
    just::lines::basic_view<std::istream, KeepNewlines> view3(fs1);

    just::lines::basic_view<std::istream, KeepNewlines> view4(s2);
    just::lines::basic_view<std::istream, KeepNewlines> view5(fs2);
    just::lines::basic_file_view<KeepNewlines> view6(path);

    converts_to<just::lines::basic_view<std::istream, KeepNewlines> >(view6);

    const vector<string> v1 = just::lines::split<KeepNewlines>(s_);
    const vector<string> v2 = just::lines::split<KeepNewlines>(&(s_[0]));
    const vector<string> v3 = just::lines::split<KeepNewlines>(string(s_));
    const vector<string> v4 = just::lines::split<KeepNewlines>(s3);
    const vector<string> v5 = just::lines::split<KeepNewlines>(fs3);
    const vector<string> v6 =
      just::lines::split_lines_of_file<KeepNewlines>(path);
    const vector<string> v7 = create_vector(view1);
    const vector<string> v8 = create_vector(view2);
    const vector<string> v9 = create_vector(view3);
    const vector<string> v10 = create_vector(view4);
    const vector<string> v11 = create_vector(view5);
    const vector<string> v12 = create_vector(view6);
    JUST_ASSERT_EQUAL_CONTAINER(v1, v2);
    JUST_ASSERT_EQUAL_CONTAINER(v2, v3);
    JUST_ASSERT_EQUAL_CONTAINER(v3, v4);
    JUST_ASSERT_EQUAL_CONTAINER(v4, v5);
    JUST_ASSERT_EQUAL_CONTAINER(v5, v6);
    JUST_ASSERT_EQUAL_CONTAINER(v6, v7);
    JUST_ASSERT_EQUAL_CONTAINER(v7, v8);
    JUST_ASSERT_EQUAL_CONTAINER(v8, v9);
    JUST_ASSERT_EQUAL_CONTAINER(v9, v10);
    JUST_ASSERT_EQUAL_CONTAINER(v10, v11);

    return v1;
  }